

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

void __thiscall
Catch::Clara::Detail::BasicResult<Catch::Clara::Detail::ParseState>::BasicResult
          (BasicResult<Catch::Clara::Detail::ParseState> *this,ResultType type,string *message)

{
  string *message_local;
  ResultType type_local;
  BasicResult<Catch::Clara::Detail::ParseState> *this_local;
  
  ResultValueBase<Catch::Clara::Detail::ParseState>::ResultValueBase
            (&this->super_ResultValueBase<Catch::Clara::Detail::ParseState>,type);
  (this->super_ResultValueBase<Catch::Clara::Detail::ParseState>).super_ResultBase._vptr_ResultBase
       = (_func_int **)&PTR__BasicResult_00291dc8;
  std::__cxx11::string::string((string *)&this->m_errorMessage,message);
  if ((this->super_ResultValueBase<Catch::Clara::Detail::ParseState>).super_ResultBase.m_type != Ok)
  {
    return;
  }
  __assert_fail("m_type != ResultType::Ok",
                "/workspace/llm4binary/github/license_all_cmakelists_25/H-EAL[P]vfs/tests/catch_amalgamated.hpp"
                ,0x10cd,
                "Catch::Clara::Detail::BasicResult<Catch::Clara::Detail::ParseState>::BasicResult(ResultType, const std::string &) [T = Catch::Clara::Detail::ParseState]"
               );
}

Assistant:

BasicResult( ResultType type,
                             std::string const& message ):
                    ResultValueBase<T>( type ), m_errorMessage( message ) {
                    assert( m_type != ResultType::Ok );
                }